

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O2

bool __thiscall
Js::ES5Array::GetPropertyBuiltIns(ES5Array *this,PropertyId propertyId,Var *value,BOOL *result)

{
  Var pvVar1;
  
  if (propertyId == 0xd1) {
    pvVar1 = JavascriptNumber::ToVar
                       ((this->super_JavascriptArray).super_ArrayObject.length,
                        (((((this->super_JavascriptArray).super_ArrayObject.super_DynamicObject.
                            super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr);
    *value = pvVar1;
    *result = 1;
  }
  return propertyId == 0xd1;
}

Assistant:

bool ES5Array::GetPropertyBuiltIns(PropertyId propertyId, Var* value, BOOL* result)
    {
        if (propertyId == PropertyIds::length)
        {
            *value = JavascriptNumber::ToVar(this->GetLength(), GetScriptContext());
            *result = true;
            return true;
        }

        return false;
    }